

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpknl(fitsfile *fptr,char *keyroot,int nstart,int nkey,int *value,char **comm,int *status)

{
  bool bVar1;
  size_t sVar2;
  int in_ECX;
  long *in_R9;
  bool bVar3;
  int *in_stack_00000008;
  int len;
  int repeat;
  int jj;
  int ii;
  char tcomment [73];
  char keyname [75];
  int local_f0;
  int local_e8;
  int local_dc;
  char local_d8 [8];
  int *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  fitsfile *in_stack_ffffffffffffffc8;
  int local_4;
  
  if (*in_stack_00000008 < 1) {
    bVar1 = false;
    if (in_R9 == (long *)0x0) {
      bVar1 = true;
      local_d8[0] = '\0';
    }
    else {
      sVar2 = strlen((char *)*in_R9);
      local_e8 = (int)sVar2;
      while( true ) {
        bVar3 = false;
        if (0 < local_e8) {
          bVar3 = *(char *)(*in_R9 + (long)(local_e8 + -1)) == ' ';
        }
        if (!bVar3) break;
        local_e8 = local_e8 + -1;
      }
      if ((0 < local_e8) && (*(char *)(*in_R9 + (long)(local_e8 + -1)) == '&')) {
        if (local_e8 < 0x49) {
          local_f0 = local_e8;
        }
        else {
          local_f0 = 0x49;
        }
        local_d8[0] = '\0';
        strncat(local_d8,(char *)*in_R9,(long)(local_f0 + -1));
        bVar1 = true;
      }
    }
    for (local_dc = 0; local_dc < in_ECX; local_dc = local_dc + 1) {
      ffkeyn(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30);
      if (bVar1) {
        ffpkyl(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      else {
        ffpkyl(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      if (0 < *in_stack_00000008) {
        return *in_stack_00000008;
      }
    }
    local_4 = *in_stack_00000008;
  }
  else {
    local_4 = *in_stack_00000008;
  }
  return local_4;
}

Assistant:

int ffpknl( fitsfile *fptr,     /* I - FITS file pointer                    */
            const char *keyroot,      /* I - root name of keywords to write       */
            int  nstart,        /* I - starting index number                */
            int  nkey,          /* I - number of keywords to write          */
            int  *value,        /* I - array of keyword values              */
            char *comm[],       /* I - array of pointers to keyword comment */
            int  *status)       /* IO - error status                        */
/*
  Write (put) an indexed array of keywords with index numbers between
  NSTART and (NSTART + NKEY -1) inclusive.  Writes logical keywords
  Values equal to zero will be written as a False FITS keyword value; any
  other non-zero value will result in a True FITS keyword.
*/
{
    char keyname[FLEN_KEYWORD], tcomment[FLEN_COMMENT];
    int ii, jj, repeat, len;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check if first comment string is to be repeated for all the keywords */
    /* by looking to see if the last non-blank character is a '&' char      */

    repeat = 0;
    if (comm)
    {
      len = strlen(comm[0]);

      while (len > 0  && comm[0][len - 1] == ' ')
        len--;                               /* ignore trailing blanks */

      if (len > 0 && comm[0][len - 1] == '&')
      {
        len = minvalue(len, FLEN_COMMENT);
        tcomment[0] = '\0';
        strncat(tcomment, comm[0], len-1); /* don't copy the final '&' char */
        repeat = 1;
      }
    }
    else
    {
      repeat = 1;
      tcomment[0] = '\0';
    }


    for (ii=0, jj=nstart; ii < nkey; ii++, jj++)
    {
        ffkeyn(keyroot, jj, keyname, status);

        if (repeat)
            ffpkyl(fptr, keyname, value[ii], tcomment, status);
        else
            ffpkyl(fptr, keyname, value[ii], comm[ii], status);

        if (*status > 0)
            return(*status);
    }
    return(*status);
}